

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

VCacheData __thiscall VGradientCache::getBuffer(VGradientCache *this,VGradient *gradient)

{
  bool bVar1;
  uint32_t uVar2;
  unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
  *this_00;
  unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
  *puVar3;
  const_reference pvVar4;
  VGradientCache *this_01;
  VGradient *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_> *in_RSI;
  element_type *in_RDI;
  VCacheData VVar5;
  _Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
  it;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>_>
  range;
  iterator search;
  size_t count;
  lock_guard<std::mutex> guard;
  uint32_t i;
  VGradientStops *stops;
  VCacheKey hash_val;
  VCacheData *info;
  undefined4 in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  element_type *__y;
  _Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
  local_88;
  pair<std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>_>
  local_80;
  _Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
  local_60;
  VGradient *in_stack_ffffffffffffffa8;
  VCacheKey in_stack_ffffffffffffffb0;
  uint local_34;
  
  __y = in_RDI;
  std::shared_ptr<const_VGradientCache::CacheInfo>::shared_ptr
            ((shared_ptr<const_VGradientCache::CacheInfo> *)0x11bb52);
  local_34 = 0;
  while( true ) {
    this_00 = (unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
               *)(ulong)local_34;
    puVar3 = (unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
              *)std::vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>::
                size(&in_RDX->mStops);
    if (puVar3 <= this_00 || 2 < local_34) break;
    pvVar4 = std::vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>::
             operator[](&in_RDX->mStops,(ulong)local_34);
    uVar2 = VColor::premulARGB(&pvVar4->second);
    in_stack_ffffffffffffff3c = (float)uVar2;
    VGradient::alpha(in_RDX);
    local_34 = local_34 + 1;
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)this_00,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  this_01 = (VGradientCache *)
            std::
            unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
            ::count(this_00,(key_type *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (this_01 == (VGradientCache *)0x0) {
    addCacheElement((VGradientCache *)0x0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::shared_ptr<const_VGradientCache::CacheInfo>::operator=
              ((shared_ptr<const_VGradientCache::CacheInfo> *)this_00,
               (shared_ptr<const_VGradientCache::CacheInfo> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::shared_ptr<const_VGradientCache::CacheInfo>::~shared_ptr
              ((shared_ptr<const_VGradientCache::CacheInfo> *)0x11bc9d);
  }
  else if (this_01 == (VGradientCache *)0x1) {
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
         ::find((unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                (key_type *)0x11bcc3);
    std::__detail::
    _Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
                  *)0x11bcd2);
    std::
    __shared_ptr_access<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x11bcde);
    bVar1 = std::operator==(in_RSI,(vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>
                                    *)__y);
    if (bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
                    *)0x11bd05);
      std::shared_ptr<const_VGradientCache::CacheInfo>::operator=
                ((shared_ptr<const_VGradientCache::CacheInfo> *)this_00,
                 (shared_ptr<const_VGradientCache::CacheInfo> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    else {
      addCacheElement(this_01,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::shared_ptr<const_VGradientCache::CacheInfo>::operator=
                ((shared_ptr<const_VGradientCache::CacheInfo> *)this_00,
                 (shared_ptr<const_VGradientCache::CacheInfo> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::shared_ptr<const_VGradientCache::CacheInfo>::~shared_ptr
                ((shared_ptr<const_VGradientCache::CacheInfo> *)0x11bd50);
    }
  }
  else {
    local_80 = std::
               unordered_multimap<long,_std::shared_ptr<const_VGradientCache::CacheInfo>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>_>_>
               ::equal_range(this_00,(key_type *)
                                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_88 = local_80.first.
               super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
               ._M_cur;
    while (bVar1 = std::__detail::operator!=
                             (&local_88,
                              &local_80.second.
                               super__Node_iterator_base<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false>
                             ), bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
      ::operator->((_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
                    *)0x11bd9e);
      std::
      __shared_ptr_access<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x11bdaa);
      bVar1 = std::operator==(in_RSI,(vector<std::pair<float,_VColor>,_std::allocator<std::pair<float,_VColor>_>_>
                                      *)__y);
      if (bVar1) {
        std::__detail::
        _Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
        ::operator->((_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
                      *)0x11bdd1);
        std::shared_ptr<const_VGradientCache::CacheInfo>::operator=
                  ((shared_ptr<const_VGradientCache::CacheInfo> *)this_00,
                   (shared_ptr<const_VGradientCache::CacheInfo> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        break;
      }
      std::__detail::
      _Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_long,_std::shared_ptr<const_VGradientCache::CacheInfo>_>,_false,_false>
                    *)this_00);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
    if (!bVar1) {
      addCacheElement(this_01,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::shared_ptr<const_VGradientCache::CacheInfo>::operator=
                ((shared_ptr<const_VGradientCache::CacheInfo> *)this_00,
                 (shared_ptr<const_VGradientCache::CacheInfo> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      std::shared_ptr<const_VGradientCache::CacheInfo>::~shared_ptr
                ((shared_ptr<const_VGradientCache::CacheInfo> *)0x11be38);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11be49);
  VVar5.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  VVar5.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __y
  ;
  return (VCacheData)
         VVar5.super___shared_ptr<const_VGradientCache::CacheInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VCacheData getBuffer(const VGradient &gradient)
    {
        VCacheKey             hash_val = 0;
        VCacheData            info;
        const VGradientStops &stops = gradient.mStops;
        for (uint32_t i = 0; i < stops.size() && i <= 2; i++)
            hash_val +=
                VCacheKey(stops[i].second.premulARGB() * gradient.alpha());

        {
            std::lock_guard<std::mutex> guard(mMutex);

            size_t count = mCache.count(hash_val);
            if (!count) {
                // key is not present in the hash
                info = addCacheElement(hash_val, gradient);
            } else if (count == 1) {
                auto search = mCache.find(hash_val);
                if (search->second->stops == stops) {
                    info = search->second;
                } else {
                    // didn't find an exact match
                    info = addCacheElement(hash_val, gradient);
                }
            } else {
                // we have a multiple data with same key
                auto range = mCache.equal_range(hash_val);
                for (auto it = range.first; it != range.second; ++it) {
                    if (it->second->stops == stops) {
                        info = it->second;
                        break;
                    }
                }
                if (!info) {
                    // didn't find an exact match
                    info = addCacheElement(hash_val, gradient);
                }
            }
        }
        return info;
    }